

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O3

void __thiscall
HighsLinearSumBounds::updatedVarLower
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarLower)

{
  int *piVar1;
  pointer piVar2;
  pointer pHVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar6 = oldVarLower;
  if (this->implVarLowerSource[var] == sum) {
    pdVar4 = this->varLower;
    dVar7 = pdVar4[var];
  }
  else {
    pdVar4 = this->varLower;
    dVar5 = this->implVarLower[var];
    if (oldVarLower <= dVar5) {
      dVar6 = dVar5;
    }
    dVar7 = pdVar4[var];
    if (pdVar4[var] <= dVar5) {
      dVar7 = dVar5;
    }
  }
  if (coefficient <= 0.0) {
    if ((dVar7 != dVar6) || (NAN(dVar7) || NAN(dVar6))) {
      if (-INFINITY < dVar6) {
        dVar6 = dVar6 * coefficient;
        pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar5 = pHVar3[sum].hi;
        dVar8 = dVar5 - dVar6;
        pHVar3[sum].hi = dVar8;
        pHVar3[sum].lo =
             (dVar5 - (dVar6 + dVar8)) + (-dVar6 - (dVar8 - (dVar6 + dVar8))) + pHVar3[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar7) {
        dVar7 = dVar7 * coefficient;
        pHVar3 = (this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar6 = pHVar3[sum].hi;
        dVar5 = dVar7 + dVar6;
        pHVar3[sum].hi = dVar5;
        pHVar3[sum].lo =
             (dVar6 - (dVar5 - dVar7)) + (dVar7 - (dVar5 - (dVar5 - dVar7))) + pHVar3[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (-INFINITY < oldVarLower) {
      dVar5 = oldVarLower * coefficient;
      pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar3[sum].hi;
      dVar7 = dVar6 - dVar5;
      pHVar3[sum].hi = dVar7;
      pHVar3[sum].lo =
           (dVar6 - (dVar5 + dVar7)) + (-dVar5 - (dVar7 - (dVar5 + dVar7))) + pHVar3[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar6 = pdVar4[var];
    if (-INFINITY < dVar6) {
      pHVar3 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      goto LAB_00377adc;
    }
    piVar2 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    if ((dVar7 != dVar6) || (NAN(dVar7) || NAN(dVar6))) {
      if (-INFINITY < dVar6) {
        dVar6 = dVar6 * coefficient;
        pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar5 = pHVar3[sum].hi;
        dVar8 = dVar5 - dVar6;
        pHVar3[sum].hi = dVar8;
        pHVar3[sum].lo =
             (dVar5 - (dVar6 + dVar8)) + (-dVar6 - (dVar8 - (dVar6 + dVar8))) + pHVar3[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (-INFINITY < dVar7) {
        dVar7 = dVar7 * coefficient;
        pHVar3 = (this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        dVar6 = pHVar3[sum].hi;
        dVar5 = dVar7 + dVar6;
        pHVar3[sum].hi = dVar5;
        pHVar3[sum].lo =
             (dVar6 - (dVar5 - dVar7)) + (dVar7 - (dVar5 - (dVar5 - dVar7))) + pHVar3[sum].lo;
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (-INFINITY < oldVarLower) {
      dVar5 = oldVarLower * coefficient;
      pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar6 = pHVar3[sum].hi;
      dVar7 = dVar6 - dVar5;
      pHVar3[sum].hi = dVar7;
      pHVar3[sum].lo =
           (dVar6 - (dVar5 + dVar7)) + (-dVar5 - (dVar7 - (dVar5 + dVar7))) + pHVar3[sum].lo;
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar6 = pdVar4[var];
    if (-INFINITY < dVar6) {
      pHVar3 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
               _M_impl.super__Vector_impl_data._M_start;
LAB_00377adc:
      dVar6 = dVar6 * coefficient;
      dVar5 = pHVar3[sum].hi;
      dVar7 = dVar6 + dVar5;
      pHVar3[sum].hi = dVar7;
      pHVar3[sum].lo =
           (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + pHVar3[sum].lo;
      return;
    }
    piVar2 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  piVar2[sum] = piVar2[sum] + 1;
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarLower(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarLower) {
  double oldVLower = implVarLowerSource[var] == sum
                         ? oldVarLower
                         : std::max(implVarLower[var], oldVarLower);

  double vLower = implVarLowerSource[var] == sum
                      ? varLower[var]
                      : std::max(implVarLower[var], varLower[var]);

  if (coefficient > 0) {
    if (vLower != oldVLower) {
      if (oldVLower == -kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVLower * coefficient;

      if (vLower == -kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vLower * coefficient;
    }

    if (oldVarLower == -kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarLower * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varLower[var] * coefficient;

  } else {
    if (vLower != oldVLower) {
      if (oldVLower == -kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVLower * coefficient;

      if (vLower == -kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vLower * coefficient;
    }
    if (oldVarLower == -kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarLower * coefficient;

    if (varLower[var] == -kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varLower[var] * coefficient;
  }
}